

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_types.cc
# Opt level: O2

void Typelib::CXX::addStandardTypes(Registry *registry)

{
  char cVar1;
  string *this;
  Type *on;
  allocator local_5a;
  allocator local_59;
  string local_58 [32];
  allocator local_38 [32];
  
  std::__cxx11::string::string(local_58,"/bool",local_38);
  cVar1 = Typelib::Registry::has((string *)registry,SUB81(local_58,0));
  std::__cxx11::string::~string(local_58);
  if (cVar1 == '\0') {
    ::addStandardTypes(registry);
  }
  std::__cxx11::string::string(local_58,"/std/string",local_38);
  cVar1 = Typelib::Registry::has((string *)registry,SUB81(local_58,0));
  std::__cxx11::string::~string(local_58);
  if (cVar1 == '\0') {
    this = (string *)operator_new(0x68);
    std::__cxx11::string::string(local_58,"/int8_t",&local_59);
    on = (Type *)Typelib::Registry::get((string *)registry);
    String::String((String *)this,on);
    std::__cxx11::string::string((string *)local_38,"",&local_5a);
    Typelib::Registry::add((Type *)registry,this);
    std::__cxx11::string::~string((string *)local_38);
    std::__cxx11::string::~string(local_58);
  }
  return;
}

Assistant:

void Typelib::CXX::addStandardTypes(Typelib::Registry& registry)
{
    if (!registry.has("/bool"))
        ::addStandardTypes(registry);
    if (!registry.has("/std/string"))
        registry.add(new String(*registry.get("/int8_t")));
}